

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.h
# Opt level: O0

void __thiscall
llvm::DelimitedScope<'{',_'}'>::DelimitedScope
          (DelimitedScope<___,____> *this,ScopedPrinter *W,StringRef N)

{
  StringRef Str;
  bool bVar1;
  raw_ostream *prVar2;
  ScopedPrinter *W_local;
  DelimitedScope<___,____> *this_local;
  StringRef N_local;
  
  N_local.Data = (char *)N.Length;
  this_local = (DelimitedScope<___,____> *)N.Data;
  this->W = W;
  prVar2 = ScopedPrinter::startLine(W);
  Str.Length = (size_t)N_local.Data;
  Str.Data = (char *)this_local;
  raw_ostream::operator<<(prVar2,Str);
  bVar1 = StringRef::empty((StringRef *)&this_local);
  if (!bVar1) {
    prVar2 = ScopedPrinter::getOStream(W);
    raw_ostream::operator<<(prVar2,' ');
  }
  prVar2 = ScopedPrinter::getOStream(W);
  prVar2 = raw_ostream::operator<<(prVar2,'{');
  raw_ostream::operator<<(prVar2,'\n');
  ScopedPrinter::indent(W,1);
  return;
}

Assistant:

DelimitedScope(ScopedPrinter &W, StringRef N) : W(W) {
    W.startLine() << N;
    if (!N.empty())
      W.getOStream() << ' ';
    W.getOStream() << Open << '\n';
    W.indent();
  }